

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * __thiscall doublechecked::Roaring::operator|(Roaring *this,Roaring *o)

{
  undefined1 uVar1;
  Roaring *pRVar2;
  Roaring *in_RSI;
  Roaring *in_RDI;
  Roaring inplace;
  Roaring *ans;
  int in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Roaring *in_stack_ffffffffffffffc8;
  Roaring *in_stack_ffffffffffffffd0;
  
  pRVar2 = in_RDI;
  roaring::Roaring::operator|((Roaring *)&stack0xffffffffffffffb8,&in_RDI->plain);
  Roaring(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  roaring::Roaring::~Roaring
            ((Roaring *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  Roaring(pRVar2,in_RSI);
  pRVar2 = operator|=(pRVar2,in_RSI);
  uVar1 = operator==(in_RDI,pRVar2);
  _assert_true((unsigned_long)in_RDI,(char *)pRVar2,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c);
  ~Roaring((Roaring *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  return in_RDI;
}

Assistant:

Roaring operator|(const Roaring &o) const {
        Roaring ans(plain | o.plain);

        Roaring inplace(*this);
        assert_true(ans ==
                    (inplace |= o));  // validate against in-place version

        return ans;
    }